

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::setEffectParam(PatternModel *this,uint8_t nibble)

{
  uint8_t uVar1;
  uint uVar2;
  long lVar3;
  uint8_t uVar4;
  TrackRow *pTVar5;
  EffectParamEditCmd *this_00;
  QUndoStack *pQVar6;
  int iVar7;
  QArrayDataPointer<char16_t> QStack_48;
  
  lVar3 = (long)((this->mCursor).super_PatternCursorBase.column + -3) / 3;
  pTVar5 = cursorTrackRow(this);
  iVar7 = (int)lVar3;
  if ((pTVar5->effects)._M_elems[iVar7].type != noEffect) {
    uVar2 = (this->mCursor).super_PatternCursorBase.column;
    uVar4 = replaceNibble((pTVar5->effects)._M_elems[iVar7].param,nibble,
                          (bool)((byte)(0x490 >> ((byte)uVar2 & 0x1f)) & uVar2 < 0xb));
    uVar1 = (pTVar5->effects)._M_elems[iVar7].param;
    if (uVar4 != uVar1) {
      this_00 = (EffectParamEditCmd *)operator_new(0x20);
      EffectParamEditCmd::EffectEditCmd(this_00,this,(uint8_t)lVar3,uVar4,uVar1,(QUndoCommand *)0x0)
      ;
      tr((QString *)&QStack_48,"edit effect parameter",(char *)0x0,-1);
      QUndoCommand::setText((QString *)this_00);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
      pQVar6 = Module::undoStack(this->mModule);
      QUndoStack::push((QUndoCommand *)pQVar6);
    }
  }
  return;
}

Assistant:

void PatternModel::setEffectParam(uint8_t nibble) {
    auto effectNo = cursorEffectNo();
    auto &rowdata = cursorTrackRow();

    auto &oldEffect = rowdata.effects[effectNo];
    if (oldEffect.type != trackerboy::EffectType::noEffect) {
        bool isHighNibble = mCursor.column == PatternCursor::ColumnEffect1ArgHigh ||
                            mCursor.column == PatternCursor::ColumnEffect2ArgHigh ||
                            mCursor.column == PatternCursor::ColumnEffect3ArgHigh;
        auto newParam = replaceNibble(oldEffect.param, nibble, isHighNibble);
        if (newParam != oldEffect.param) {
            auto cmd = new EffectParamEditCmd(
                *this,
                (uint8_t)effectNo,
                newParam,
                oldEffect.param
            );
            cmd->setText(tr("edit effect parameter"));
            mModule.undoStack()->push(cmd);
        }
    }
        
}